

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

Pass * wasm::createUnsubtypingPass(void)

{
  Unsubtyping *this;
  
  this = (Unsubtyping *)operator_new(0x298);
  memset(this,0,0x298);
  anon_unknown_22::Unsubtyping::Unsubtyping(this);
  return (Pass *)this;
}

Assistant:

Pass* createUnsubtypingPass() { return new Unsubtyping(); }